

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_font_renderer.cpp
# Opt level: O2

GlyphMetrics * __thiscall
StbFontRenderer::getGlyphMetrics
          (GlyphMetrics *__return_storage_ptr__,StbFontRenderer *this,GlyphIndex glyphIdx)

{
  float scale_x;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  ushort uVar5;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int yMax;
  int yMin;
  int xMax;
  int xMin;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  puVar2 = (this->font).data;
  uVar5 = *(ushort *)(puVar2 + (long)(this->font).hhea + 0x22) << 8 |
          *(ushort *)(puVar2 + (long)(this->font).hhea + 0x22) >> 8;
  iVar1 = (this->font).hmtx;
  lVar3 = (ulong)uVar5 * 4 + (long)iVar1 + -4;
  lVar4 = (ulong)uVar5 * 4 + (long)iVar1 + -3;
  if ((int)glyphIdx < (int)(uint)uVar5) {
    lVar3 = (long)(int)(glyphIdx * 4) + (long)iVar1;
    lVar4 = (long)(int)(glyphIdx * 4) + 1 + (long)iVar1;
  }
  scale_x = this->scale;
  __return_storage_ptr__->advance =
       (int)((float)(int)CONCAT11(puVar2[lVar3],puVar2[lVar4]) * scale_x);
  stbtt_GetGlyphBitmapBoxSubpixel
            (&this->font,glyphIdx,scale_x,scale_x,in_XMM2_Da,in_XMM3_Da,&local_2c,&local_34,
             &local_30,&local_38);
  (__return_storage_ptr__->size).w = local_30 - local_2c;
  (__return_storage_ptr__->size).h = local_38 - local_34;
  (__return_storage_ptr__->offset).x = local_2c;
  (__return_storage_ptr__->offset).y = -local_34;
  return __return_storage_ptr__;
}

Assistant:

dpfb::GlyphMetrics StbFontRenderer::getGlyphMetrics(
    dpfb::GlyphIndex glyphIdx) const
{
    dpfb::GlyphMetrics glyphMetrics;

    stbtt_GetGlyphHMetrics(
        &font, glyphIdx, &glyphMetrics.advance, nullptr);
    glyphMetrics.advance *= scale;

    int xMin, xMax, yMin, yMax;
    stbtt_GetGlyphBitmapBox(
        &font, glyphIdx, scale, scale, &xMin, &yMin, &xMax, &yMax);

    glyphMetrics.size.w = xMax - xMin;
    glyphMetrics.size.h = yMax - yMin;
    glyphMetrics.offset.x = xMin;

    // stbtt converts coordinates so y increases down.
    // Positive yMin in stbtt is negative yMax in FreeType.
    // We use FreeType's convention, so negate back.
    glyphMetrics.offset.y = -yMin;

    return glyphMetrics;
}